

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_rng.c
# Opt level: O2

bool_t cmdTermEcho(bool_t on)

{
  uint uVar1;
  termios attr;
  termios local_54;
  
  fflush(_stdout);
  tcgetattr(0,&local_54);
  uVar1 = local_54.c_lflag >> 3;
  local_54.c_lflag = (local_54.c_lflag & 0xfffffff7) + (uint)(on != 0) * 8;
  tcsetattr(0,0,&local_54);
  return uVar1 & 1;
}

Assistant:

static bool_t cmdTermEcho(bool_t on)
{
	bool_t prev;
	struct termios attr;
	fflush(stdout);
	tcgetattr(STDIN_FILENO, &attr);
	prev = (attr.c_lflag & ECHO) != 0;
	if (on)
		attr.c_lflag |= ECHO;
	else
		attr.c_lflag &= ~ECHO;
	tcsetattr(STDIN_FILENO, TCSANOW, &attr);
	return prev;
}